

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall ipx::Model::LoadDual(Model *this)

{
  SparseMatrix *this_00;
  pointer piVar1;
  pointer pdVar2;
  pointer pcVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  double dVar14;
  undefined1 local_b0 [112];
  pointer pdStack_40;
  pointer local_38;
  
  this->num_rows_ = this->num_var_;
  this->num_cols_ =
       (int)((ulong)((long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) + this->num_constr_;
  this->dualized_ = true;
  Transpose((SparseMatrix *)local_b0,&this->A_);
  (this->AI_).nrow_ = local_b0._0_4_;
  piVar1 = (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b0._8_8_;
  (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_b0._16_8_;
  (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_b0._24_8_;
  local_b0._8_8_ = (pointer)0x0;
  local_b0._16_8_ = (pointer)0x0;
  local_b0._24_8_ = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b0._32_8_;
  (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_b0._40_8_;
  (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_b0._48_8_;
  local_b0._32_8_ = (pointer)0x0;
  local_b0._40_8_ = (pointer)0x0;
  local_b0._48_8_ = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pdVar2 = (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b0._56_8_;
  (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b0._64_8_;
  (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b0._72_8_;
  local_b0._56_8_ = (pointer)0x0;
  local_b0._64_8_ = (pointer)0x0;
  local_b0._72_8_ = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar1 = (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b0._80_8_;
  (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b0._88_8_;
  (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b0._96_8_;
  local_b0._80_8_ = (pointer)0x0;
  local_b0._88_8_ = (pointer)0x0;
  local_b0._96_8_ = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pdVar2 = (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b0._104_8_;
  (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_40;
  (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  stack0xffffffffffffffb8 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  if ((pointer)local_b0._104_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._104_8_);
  }
  if ((pointer)local_b0._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._80_8_);
  }
  if ((pointer)local_b0._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._56_8_);
  }
  if ((pointer)local_b0._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._32_8_);
  }
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._8_8_);
  }
  this_00 = &this->AI_;
  if (0 < this->num_var_) {
    lVar12 = 0;
    do {
      if ((ulong)ABS((this->scaled_ubuser_)._M_data[lVar12]) < 0x7ff0000000000000) {
        SparseMatrix::push_back(this_00,(Int)lVar12,-1.0);
        SparseMatrix::add_column(this_00);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->num_var_);
  }
  if (0 < this->num_rows_) {
    iVar7 = 0;
    do {
      SparseMatrix::push_back(this_00,iVar7,1.0);
      SparseMatrix::add_column(this_00);
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->num_rows_);
  }
  sVar13 = (this->b_)._M_size;
  if (sVar13 == (this->scaled_obj_)._M_size) {
    if (sVar13 == 0) goto LAB_003aee11;
    pdVar4 = (this->b_)._M_data;
    pdVar6 = (this->scaled_obj_)._M_data;
  }
  else {
    pdVar4 = (this->b_)._M_data;
    if (pdVar4 != (double *)0x0) {
      operator_delete(pdVar4);
    }
    sVar13 = (this->scaled_obj_)._M_size;
    (this->b_)._M_size = sVar13;
    pdVar4 = (double *)operator_new(sVar13 << 3);
    (this->b_)._M_data = pdVar4;
    pdVar6 = (this->scaled_obj_)._M_data;
    if (pdVar6 == (double *)0x0) goto LAB_003aee11;
    sVar13 = (this->b_)._M_size;
  }
  memcpy(pdVar4,pdVar6,sVar13 << 3);
LAB_003aee11:
  sVar13 = (long)this->num_rows_ + (long)this->num_cols_;
  if ((this->c_)._M_size != sVar13) {
    operator_delete((this->c_)._M_data);
    (this->c_)._M_size = sVar13;
    pdVar4 = (double *)operator_new(sVar13 * 8);
    (this->c_)._M_data = pdVar4;
  }
  pdVar4 = (this->c_)._M_data;
  if ((int)sVar13 != 0) {
    memset(pdVar4,0,sVar13 * 8);
  }
  sVar13 = (this->scaled_rhs_)._M_size;
  pdVar5 = (this->scaled_rhs_)._M_data;
  pdVar6 = pdVar5 + sVar13;
  if (sVar13 == 0) {
    pdVar6 = (double *)0x0;
    pdVar5 = (double *)0x0;
  }
  iVar7 = 0;
  pdVar8 = pdVar4;
  for (; pdVar5 != pdVar6; pdVar5 = pdVar5 + 1) {
    *pdVar8 = -*pdVar5;
    pdVar8 = pdVar8 + 1;
    iVar7 = iVar7 + 1;
  }
  sVar13 = (this->scaled_ubuser_)._M_size;
  pdVar5 = (this->scaled_ubuser_)._M_data;
  pdVar6 = pdVar5 + sVar13;
  if (sVar13 == 0) {
    pdVar6 = (double *)0x0;
    pdVar5 = (double *)0x0;
  }
  for (; pdVar5 != pdVar6; pdVar5 = pdVar5 + 1) {
    if ((ulong)ABS(*pdVar5) < 0x7ff0000000000000) {
      lVar12 = (long)iVar7;
      iVar7 = iVar7 + 1;
      pdVar4[lVar12] = *pdVar5;
    }
  }
  sVar13 = (this->scaled_lbuser_)._M_size;
  pdVar5 = (this->scaled_lbuser_)._M_data;
  pdVar6 = pdVar5 + sVar13;
  if (sVar13 == 0) {
    pdVar6 = (double *)0x0;
    pdVar5 = (double *)0x0;
  }
  if (pdVar5 != pdVar6) {
    pdVar4 = pdVar4 + iVar7;
    do {
      if ((ulong)ABS(*pdVar5) < 0x7ff0000000000000) {
        dVar14 = -*pdVar5;
      }
      else {
        dVar14 = 0.0;
      }
      *pdVar4 = dVar14;
      pdVar5 = pdVar5 + 1;
      pdVar4 = pdVar4 + 1;
    } while (pdVar5 != pdVar6);
  }
  sVar13 = (long)this->num_rows_ + (long)this->num_cols_;
  if ((this->lb_)._M_size != sVar13) {
    operator_delete((this->lb_)._M_data);
    (this->lb_)._M_size = sVar13;
    pdVar4 = (double *)operator_new(sVar13 * 8);
    (this->lb_)._M_data = pdVar4;
  }
  if ((int)sVar13 != 0) {
    memset((this->lb_)._M_data,0,sVar13 * 8);
  }
  sVar13 = (long)this->num_rows_ + (long)this->num_cols_;
  if ((this->ub_)._M_size != sVar13) {
    operator_delete((this->ub_)._M_data);
    (this->ub_)._M_size = sVar13;
    pdVar4 = (double *)operator_new(sVar13 * 8);
    (this->ub_)._M_data = pdVar4;
  }
  pdVar4 = (this->ub_)._M_data;
  if ((int)sVar13 != 0) {
    memset(pdVar4,0,sVar13 * 8);
  }
  iVar7 = this->num_constr_;
  lVar12 = (long)iVar7;
  if (0 < lVar12) {
    pdVar6 = (this->lb_)._M_data;
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      bVar10 = pcVar3[lVar9] - 0x3c;
      if (bVar10 < 3) {
        lVar11 = (ulong)bVar10 * 8;
        dVar14 = *(double *)(&DAT_003e3950 + lVar11);
        pdVar6[lVar9] = *(double *)(&DAT_003e3938 + lVar11);
        pdVar4[lVar9] = dVar14;
      }
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  lVar9 = (long)this->num_cols_;
  if (iVar7 < this->num_cols_) {
    pdVar6 = (this->lb_)._M_data;
    do {
      pdVar6[lVar12] = 0.0;
      pdVar4[lVar12] = INFINITY;
      lVar12 = lVar12 + 1;
    } while (lVar9 != lVar12);
  }
  iVar7 = this->num_var_;
  if (0 < (long)iVar7) {
    pdVar6 = (this->lb_)._M_data;
    pdVar5 = (this->scaled_lbuser_)._M_data;
    lVar12 = 0;
    do {
      pdVar6[lVar9 + lVar12] = 0.0;
      dVar14 = INFINITY;
      if (0x7fefffffffffffff < (ulong)ABS(pdVar5[lVar12])) {
        dVar14 = 0.0;
      }
      pdVar4[lVar9 + lVar12] = dVar14;
      lVar12 = lVar12 + 1;
    } while (iVar7 != lVar12);
  }
  return;
}

Assistant:

void Model::LoadDual() {
    num_rows_ = num_var_;
    num_cols_ = num_constr_ + boxed_vars_.size();
    dualized_ = true;

    // Check that every variable with finite scaled_ubuser_ has finite
    // scaled_lbuser_ (must be the case after scaling).
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]))
            assert(std::isfinite(scaled_lbuser_[j]));
    }

    // Build AI.
    AI_ = Transpose(A_);
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j])) {
            AI_.push_back(j, -1.0);
            AI_.add_column();
        }
    }
    assert(AI_.cols() == num_cols_);
    for (Int i = 0; i < num_rows_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }

    // Build vectors.
    b_ = scaled_obj_;
    c_.resize(num_cols_+num_rows_);
    Int put = 0;
    for (double x : scaled_rhs_)
        c_[put++] = -x;
    for (double x : scaled_ubuser_)
        if (std::isfinite(x))
            c_[put++] = x;
    assert(put == num_cols_);
    for (double x : scaled_lbuser_)
        // If x is negative infinity, then the variable will be fixed and we can
        // give it any (finite) cost.
        c_[put++] = std::isfinite(x) ? -x : 0.0;
    lb_.resize(num_cols_+num_rows_);
    ub_.resize(num_cols_+num_rows_);
    for (Int i = 0; i < num_constr_; i++)
        switch(constr_type_[i]) {
        case '=':
            lb_[i] = -INFINITY;
            ub_[i] = INFINITY;
            break;
        case '<':
            lb_[i] = -INFINITY;
            ub_[i] = 0.0;
            break;
        case '>':
            lb_[i] = 0.0;
            ub_[i] = INFINITY;
            break;
        }
    for (Int j = num_constr_; j < num_cols_; j++) {
        lb_[j] = 0.0;
        ub_[j] = INFINITY;
    }
    for (Int j = 0; j < num_var_; j++) {
        lb_[num_cols_+j] = 0.0;
        ub_[num_cols_+j] = std::isfinite(scaled_lbuser_[j]) ? INFINITY : 0.0;
    }
}